

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase139::run(TestCase139 *this)

{
  size_t in_RSI;
  Array<kj::(anonymous_namespace)::TestObject> array;
  DebugComparison<int,_int_&> _kjCondition;
  bool local_4f0;
  NullableValue<kj::Exception> local_4e8;
  NullableValue<kj::Exception> local_350;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  heapArray<kj::(anonymous_namespace)::TestObject>(&array,in_RSI);
  _kjCondition.result = (anonymous_namespace)::TestObject::count == 0x20;
  _kjCondition.left = 0x20;
  _kjCondition.right = &(anonymous_namespace)::TestObject::count;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
    local_4e8.isSet = true;
    local_4e8._1_3_ = 0;
    _::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x90,ERROR,
               "\"failed: expected \" \"(32) == (TestObject::count)\", _kjCondition, 32, TestObject::count"
               ,(char (*) [45])"failed: expected (32) == (TestObject::count)",&_kjCondition,
               (int *)&local_4e8,&(anonymous_namespace)::TestObject::count);
  }
  (anonymous_namespace)::TestObject::throwAt = 0x10;
  Array<kj::(anonymous_namespace)::TestObject>::dispose(&array);
  local_350.isSet = false;
  Maybe<kj::Exception>::Maybe((Maybe<kj::Exception> *)&local_4e8,(Maybe<kj::Exception> *)&local_350)
  ;
  _::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)&_kjCondition,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_4e8,(None *)&none);
  _::NullableValue<kj::Exception>::~NullableValue(&local_4e8);
  _::NullableValue<kj::Exception>::~NullableValue(&local_350);
  if ((local_4f0 == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x94,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { array = nullptr; }) != kj::none\", _kjCondition"
               ,(char (*) [85])
                "failed: expected ::kj::runCatchingExceptions([&]() { array = nullptr; }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)&_kjCondition);
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition);
  _kjCondition.left = 0;
  _kjCondition.result = (anonymous_namespace)::TestObject::count == 0;
  _kjCondition.right = &(anonymous_namespace)::TestObject::count;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
    local_4e8.isSet = false;
    local_4e8._1_3_ = 0;
    _::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x95,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", _kjCondition, 0, TestObject::count"
               ,(char (*) [44])"failed: expected (0) == (TestObject::count)",&_kjCondition,
               (int *)&local_4e8,&(anonymous_namespace)::TestObject::count);
  }
  Array<kj::(anonymous_namespace)::TestObject>::~Array(&array);
  return;
}

Assistant:

TEST(Array, ThrowingDestructor) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Array<TestObject> array = heapArray<TestObject>(32);
  EXPECT_EQ(32, TestObject::count);

  // If a destructor throws, all elements should still be destroyed.
  TestObject::throwAt = 16;
  EXPECT_ANY_THROW(array = nullptr);
  EXPECT_EQ(0, TestObject::count);
}